

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksInDomain
          (Registry *this,string *aDomainName,NetworkArray *aRet)

{
  __type_conflict1 _Var1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  DomainId local_174;
  undefined1 local_170 [8];
  Domain dom;
  undefined1 local_140 [8];
  Network curNwk;
  Domain curDom;
  undefined1 local_a8 [8];
  Network nwk;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  Status status;
  NetworkArray *aRet_local;
  string *aDomainName_local;
  Registry *this_local;
  
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            *)&nwk.mCcm);
  Network::Network((Network *)local_a8);
  _Var1 = std::operator==(aDomainName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
  if (_Var1) {
    Domain::Domain((Domain *)&curNwk.mCcm);
    Network::Network((Network *)local_140);
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         GetCurrentNetwork(this,(Network *)local_140);
    if (domains.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
      iVar2 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                        (this->mStorage,local_140 + 4,&curNwk.mCcm);
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           anon_unknown_0::MapStatus((Status)iVar2);
    }
    if (domains.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::push_back((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   *)&nwk.mCcm,(value_type *)&curNwk.mCcm);
      dom.mName.field_2._12_4_ = 0;
    }
    else {
      dom.mName.field_2._12_4_ = 4;
    }
    Network::~Network((Network *)local_140);
    Domain::~Domain((Domain *)&curNwk.mCcm);
    if (dom.mName.field_2._12_4_ != 0) goto joined_r0x002156a3;
LAB_002157b0:
    sVar3 = std::
            vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    *)&nwk.mCcm);
    if (sVar3 < 2) {
      pvVar4 = std::
               vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ::operator[]((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             *)&nwk.mCcm,0);
      local_a8._4_4_ = (pvVar4->mId).mId;
      iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,local_a8,aRet);
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           anon_unknown_0::MapStatus((Status)iVar2);
    }
    else {
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kAmbiguity;
    }
  }
  else {
    DomainId::DomainId(&local_174,0xffffffff);
    Domain::Domain((Domain *)local_170,&local_174,aDomainName);
    iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,local_170,&nwk.mCcm);
    domains.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         anon_unknown_0::MapStatus((Status)iVar2);
    if (domains.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
      dom.mName.field_2._12_4_ = 0;
    }
    else {
      dom.mName.field_2._12_4_ = 4;
    }
    Domain::~Domain((Domain *)local_170);
    if (dom.mName.field_2._12_4_ == 0) goto LAB_002157b0;
joined_r0x002156a3:
    if (dom.mName.field_2._12_4_ != 4) goto LAB_0021583c;
  }
  this_local._7_1_ =
       domains.
       super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  dom.mName.field_2._12_4_ = 1;
LAB_0021583c:
  Network::~Network((Network *)local_a8);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             *)&nwk.mCcm);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::GetNetworksInDomain(const std::string &aDomainName, NetworkArray &aRet)
{
    Registry::Status    status;
    std::vector<Domain> domains;
    Network             nwk{};

    if (aDomainName == ALIAS_THIS)
    {
        Domain  curDom;
        Network curNwk;
        status = GetCurrentNetwork(curNwk);
        if (status == Registry::Status::kSuccess)
        {
            status = MapStatus(mStorage->Get(curNwk.mDomainId, curDom));
        }
        VerifyOrExit(status == Registry::Status::kSuccess);
        domains.push_back(curDom);
    }
    else
    {
        Domain dom{DomainId{EMPTY_ID}, aDomainName};
        VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, domains))) == Registry::Status::kSuccess);
    }
    VerifyOrExit(domains.size() < 2, status = Registry::Status::kAmbiguity);
    nwk.mDomainId = domains[0].mId;
    status        = MapStatus(mStorage->Lookup(nwk, aRet));
exit:
    return status;
}